

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int unpack_filename(char *file,char *dir,char *name,char *ver,int checkp)

{
  char *pcVar1;
  char *cp;
  int checkp_local;
  char *ver_local;
  char *name_local;
  char *dir_local;
  char *file_local;
  
  pcVar1 = strrchr(file,0x2f);
  if (pcVar1 == (char *)0x0) {
    file_local._4_4_ = 0;
  }
  else {
    name_local = dir;
    dir_local = file;
    if (pcVar1 == file) {
      *dir = '/';
      dir[1] = '\0';
    }
    else {
      while (dir_local != pcVar1) {
        *name_local = *dir_local;
        name_local = name_local + 1;
        dir_local = dir_local + 1;
      }
      *name_local = '\0';
    }
    strcpy(name,pcVar1 + 1);
    separate_version(name,ver,checkp);
    file_local._4_4_ = 1;
  }
  return file_local._4_4_;
}

Assistant:

int unpack_filename(char *file, char *dir, char *name, char *ver, int checkp)
{
  char *cp;

#ifdef DOS
  if ((cp = (char *)max((UNSIGNED)strrchr(file, DIRSEP), (UNSIGNED)strrchr(file, UNIXDIRSEP))) == 0)
    return (0);

  if (file[1] == DRIVESEP) { /* There's a drive spec; copy it and ignore it from here on. */
    *dir++ = *file++;
    *dir++ = *file++;
  }
#else  /* DOS */
  if ((cp = (char *)strrchr(file, UNIXDIRSEP)) == NULL) return (0);
#endif /* DOS */

  if (cp == file) {
    /* File is on a root directory. */
    *dir = '/';
    *(dir + 1) = '\0';
  } else {
    while (file != cp) *dir++ = *file++;
    *dir = '\0';
  }

  strcpy(name, cp + 1);
  separate_version(name, ver, checkp);
  return (1);
}